

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::AddSegs(FNodeBuilder *this,seg_t *segs,int numsegs)

{
  DWORD DVar1;
  DWORD DVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  line_t_conflict *plVar6;
  FPrivVert *pFVar7;
  FPrivSeg *pFVar8;
  FPrivSeg *pFVar9;
  seg_t *psVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  FPrivVert vert;
  int local_78;
  undefined4 local_68;
  undefined4 local_64;
  seg_t *local_58;
  long local_50;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg> *local_48;
  sector_t_conflict *local_40;
  sector_t_conflict *local_38;
  
  if (0 < numsegs) {
    local_48 = &this->Segs;
    local_50 = (ulong)(uint)numsegs * 0x30;
    lVar13 = 0;
    local_58 = segs;
    do {
      psVar10 = local_58;
      pdVar4 = *(double **)((long)&local_58->v1 + lVar13);
      local_38 = *(sector_t_conflict **)((long)&local_58->frontsector + lVar13);
      local_40 = *(sector_t_conflict **)((long)&local_58->backsector + lVar13);
      local_68 = SUB84(*pdVar4 + 103079215104.0,0);
      local_64 = SUB84(pdVar4[1] + 103079215104.0,0);
      iVar11 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_68);
      pdVar4 = *(double **)((long)&psVar10->v2 + lVar13);
      local_68 = SUB84(*pdVar4 + 103079215104.0,0);
      local_64 = SUB84(pdVar4[1] + 103079215104.0,0);
      iVar12 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_68);
      lVar5 = *(long *)((long)&psVar10->sidedef + lVar13);
      if (lVar5 == 0) {
        local_78 = -1;
      }
      else {
        local_78 = (int)((ulong)(lVar5 - (long)this->Level->Sides) >> 6) * -0x55555555;
      }
      lVar5 = *(long *)((long)&psVar10->linedef + lVar13);
      plVar6 = this->Level->Lines;
      pFVar7 = (this->Vertices).Array;
      DVar1 = pFVar7[iVar11].segs;
      DVar2 = pFVar7[iVar12].segs2;
      TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(local_48,1);
      pFVar8 = (this->Segs).Array;
      uVar3 = (this->Segs).Count;
      pFVar8[uVar3].v1 = iVar11;
      pFVar8[uVar3].v2 = iVar12;
      pFVar8[uVar3].sidedef = local_78;
      pFVar8[uVar3].linedef = (int)((ulong)(lVar5 - (long)plVar6) >> 3) * 0x286bca1b;
      pFVar8[uVar3].frontsector = local_38;
      pFVar8[uVar3].backsector = local_40;
      pFVar8[uVar3].next = 0xffffffff;
      pFVar8[uVar3].nextforvert = DVar1;
      pFVar8[uVar3].nextforvert2 = DVar2;
      pFVar9 = pFVar8 + uVar3;
      pFVar9->loopnum = 0;
      pFVar9->partner = 0xffffffff;
      *(undefined8 *)(&pFVar9->loopnum + 2) = 0xffffffffffffffff;
      pFVar8[uVar3].planefront = false;
      pFVar8[uVar3].hashnext = (FPrivSeg *)0x0;
      uVar3 = (this->Segs).Count;
      (this->Segs).Count = uVar3 + 1;
      pFVar7 = (this->Vertices).Array;
      pFVar7[iVar11].segs = uVar3;
      pFVar7[iVar12].segs2 = uVar3;
      lVar13 = lVar13 + 0x30;
    } while (local_50 != lVar13);
    return;
  }
  __assert_fail("numsegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                ,0xcf,"void FNodeBuilder::AddSegs(seg_t *, int)");
}

Assistant:

void FNodeBuilder::AddSegs(seg_t *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		seg.frontsector = segs[i].frontsector;
		seg.backsector = segs[i].backsector;
		vert.x = segs[i].v1->fixX();
		vert.y = segs[i].v1->fixY();
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = segs[i].v2->fixX();
		vert.y = segs[i].v2->fixY();
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(segs[i].linedef - Level.Lines);
		seg.sidedef = segs[i].sidedef != NULL ? int(segs[i].sidedef - Level.Sides) : int(NO_SIDE);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}